

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

void __thiscall
t_dart_generator::generate_dart_struct_tostring
          (t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *ptVar1;
  pointer pcVar2;
  t_struct *ptVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  pointer pptVar8;
  string field_name;
  string local_228;
  e_req local_204;
  t_struct *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  pointer local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_200 = tstruct;
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"String toString()",0x11);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  scope_up(this,out,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"StringBuffer ret = new StringBuffer(\"",0x25);
  ptVar3 = local_200;
  iVar6 = (*(local_200->super_t_type).super_t_doc._vptr_t_doc[3])(local_200);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var,iVar6))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(\");",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
  pptVar8 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar8 !=
      (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar5 = true;
    do {
      local_204 = (*pptVar8)->req_;
      if (local_204 == T_OPTIONAL) {
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (",4);
        generate_isset_check_abi_cxx11_(&local_228,this,*pptVar8);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," ","");
        scope_up(this,out,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      ptVar1 = *pptVar8;
      pcVar2 = (ptVar1->name_)._M_dataplus._M_p;
      local_1f8 = &local_1e8;
      local_1d8 = pptVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,pcVar2,pcVar2 + (ptVar1->name_)._M_string_length);
      paVar4 = local_1f8;
      iVar6 = tolower((int)local_1f8->_M_local_buf[0]);
      paVar4->_M_local_buf[0] = (char)iVar6;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      if (local_1f8 == &local_1e8) {
        local_228.field_2._8_8_ = local_1e8._8_8_;
      }
      else {
        local_228._M_dataplus._M_p = (pointer)local_1f8;
      }
      local_228.field_2._M_allocated_capacity._1_7_ = local_1e8._M_allocated_capacity._1_7_;
      local_228.field_2._M_local_buf[0] = local_1e8._M_local_buf[0];
      local_228._M_string_length = local_1f0;
      local_1f0 = 0;
      local_1e8._M_local_buf[0] = '\0';
      local_1f8 = &local_1e8;
      if (!bVar5) {
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret.write(\", \");",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret.write(\"",0xb);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":\");",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      bVar5 = type_can_be_null(this,ptVar1->type_);
      pptVar8 = local_1d8;
      if (bVar5) {
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (this.",9);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," == null)",9);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," ","");
        scope_up(this,out,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret.write(\"null\");",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," else","");
        scope_down(this,out,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0," ","");
        scope_up(this,out,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
      }
      iVar6 = (*(ptVar1->type_->super_t_doc)._vptr_t_doc[7])();
      if ((char)iVar6 == '\0') {
        iVar6 = (*(ptVar1->type_->super_t_doc)._vptr_t_doc[10])();
        if ((char)iVar6 == '\0') {
          poVar7 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret.write(this.",0xf);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
          goto LAB_001bbd9b;
        }
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"String ",7);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_name = ",8);
        get_ttype_class_name_abi_cxx11_(&local_110,this,ptVar1->type_);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_110._M_dataplus._M_p,local_110._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".VALUES_TO_NAMES[this.",0x16);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (",4);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_name != null)",0xe);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130," ","");
        scope_up(this,out,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret.write(",10);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_name);",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret.write(\" (\");",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
        scope_down(this,out,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret.write(this.",0xf);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (",4);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_name != null)",0xe);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150," ","");
        scope_up(this,out,&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret.write(\")\");",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
        scope_down(this,out,&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
      }
      else {
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret.write(\"BINARY\");",0x14);
LAB_001bbd9b:
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if (bVar5) {
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
        scope_down(this,out,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
      }
      if (local_204 == T_OPTIONAL) {
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
        scope_down(this,out,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      pptVar8 = pptVar8 + 1;
      bVar5 = false;
    } while (pptVar8 !=
             (local_200->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ret.write(\")\");",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return ret.toString();",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct_tostring(ostream& out,
                                                   t_struct* tstruct) {
  indent(out) << "String toString()";
  scope_up(out);

  indent(out) << "StringBuffer ret = new StringBuffer(\""
              << tstruct->get_name() << "(\");" << endl2;

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    bool could_be_unset = (*f_iter)->get_req() == t_field::T_OPTIONAL;
    if (could_be_unset) {
      indent(out) << "if (" << generate_isset_check(*f_iter) << ")";
      scope_up(out);
    }

    t_field* field = (*f_iter);
    std::string field_name = get_member_name(field->get_name());

    if (!first) {
      indent(out) << "ret.write(\", \");" << endl;
    }
    indent(out) << "ret.write(\"" << field_name << ":\");" << endl;
    bool can_be_null = type_can_be_null(field->get_type());
    if (can_be_null) {
      indent(out) << "if (this." << field_name << " == null)";
      scope_up(out);
      indent(out) << "ret.write(\"null\");" << endl;
      scope_down(out, " else");
      scope_up(out);
    }

    if (field->get_type()->is_binary()) {
      indent(out) << "ret.write(\"BINARY\");" << endl;
    } else if (field->get_type()->is_enum()) {
      indent(out) << "String " << field_name << "_name = "
                  << get_ttype_class_name(field->get_type())
                  << ".VALUES_TO_NAMES[this." << field_name << "];" << endl;
      indent(out) << "if (" << field_name << "_name != null)";
      scope_up(out);
      indent(out) << "ret.write(" << field_name << "_name);" << endl;
      indent(out) << "ret.write(\" (\");" << endl;
      scope_down(out);
      indent(out) << "ret.write(this." << field_name << ");" << endl;
      indent(out) << "if (" << field_name << "_name != null)";
      scope_up(out);
      indent(out) << "ret.write(\")\");" << endl;
      scope_down(out);
    } else {
      indent(out) << "ret.write(this." << field_name << ");" << endl;
    }

    if (can_be_null) {
      scope_down(out);
    }
    if (could_be_unset) {
      scope_down(out);
    }

    out << endl;
    first = false;
  }

  indent(out) << "ret.write(\")\");" << endl2;

  indent(out) << "return ret.toString();" << endl;

  scope_down(out, endl2);
}